

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priest.c
# Opt level: O1

void intemple(int roomno)

{
  uint uVar1;
  bool bVar2;
  boolean bVar3;
  boolean bVar4;
  uint uVar5;
  int iVar6;
  monst *pmVar7;
  obj *poVar8;
  char cVar9;
  char *pcVar10;
  char *line;
  char *__s;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  char buf [256];
  char local_138 [264];
  
  pmVar7 = findpriest((char)roomno);
  if (u.urooms0[0] != '\0') {
    pcVar10 = u.urooms0;
    cVar9 = u.urooms0[0];
    do {
      pcVar10 = pcVar10 + 1;
      if (*(char *)((long)level->monsters + (long)cVar9 * 0xd8 + 0x335c) == '\n') {
        return;
      }
      cVar9 = *pcVar10;
    } while (cVar9 != '\0');
  }
  if (pmVar7 != (monst *)0x0) {
    bVar3 = has_shrine(pmVar7);
    bVar4 = on_level(&u.uz,&dungeon_topology.d_sanctum_level);
    bVar11 = bVar4 == '\0';
    bVar12 = u.uz.dnum != dungeon_topology.d_astral_level.dnum;
    uVar5 = *(uint *)&pmVar7->field_0x60;
    bVar13 = (uVar5 & 0xc0000) == 0x40000;
    bVar14 = flags.soundok != '\0';
    if (!bVar14 || !bVar13) goto LAB_00228680;
    if ((!bVar12 || !bVar11) &&
       (((u.uprops[0x23].intrinsic == 0 || (u.uprops[0x24].extrinsic != 0)) ||
        ((u.umonnum != u.umonster && (bVar4 = dmgtype(youmonst.data,0x24), bVar4 != '\0')))))) {
      pmVar7->field_0x63 = pmVar7->field_0x63 & 0xef;
    }
    if (pmVar7->wormno == '\0') {
      if ((viz_array[pmVar7->my][pmVar7->mx] & 2U) != 0) goto LAB_002285ed;
      if (((u.uprops[0x1e].intrinsic == 0) &&
          (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
           (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
         ((pcVar10 = "A nearby voice", ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
        if ((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
           (((youmonst.data)->mflags3 & 0x100) == 0)) goto LAB_0022865d;
        pcVar10 = "A nearby voice";
        if (((viz_array[pmVar7->my][pmVar7->mx] & 1U) != 0) &&
           ((pmVar7->data->mflags3 & 0x200) != 0)) goto LAB_002285ed;
      }
    }
    else {
      bVar4 = worm_known(level,pmVar7);
      if (bVar4 != '\0') {
LAB_002285ed:
        uVar1 = *(uint *)&pmVar7->field_0x60;
        if ((((uVar1 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0)
           ) {
          if ((uVar1 & 0x280) != 0) goto LAB_0022865d;
        }
        else {
          pcVar10 = "A nearby voice";
          if (((uVar1 & 0x280) != 0) || (((youmonst.data)->mflags1 & 0x1000000) == 0))
          goto LAB_00228664;
        }
        if ((u._1052_1_ & 0x20) == 0) {
          pcVar10 = Monnam(pmVar7);
          goto LAB_00228664;
        }
      }
LAB_0022865d:
      pcVar10 = "A nearby voice";
    }
LAB_00228664:
    pline("%s intones:",pcVar10);
    *(uint *)&pmVar7->field_0x60 = *(uint *)&pmVar7->field_0x60 & 0xefffffff | uVar5 & 0x10000000;
LAB_00228680:
    if ((bVar12 && bVar11) ||
       (bVar4 = on_level(&u.uz,&dungeon_topology.d_sanctum_level), bVar4 == '\0')) {
      pcVar10 = "sacred";
      if (bVar3 == '\0') {
        pcVar10 = "desecrated";
      }
      line = (char *)0x0;
      __s = local_138;
      sprintf(__s,"Pilgrim, you enter a %s place!",pcVar10);
      bVar2 = true;
    }
    else if ((*(uint *)&pmVar7->field_0x60 >> 0x16 & 1) == 0) {
      __s = "You desecrate this place by your presence!";
      bVar2 = true;
      line = (char *)0x0;
    }
    else {
      *(uint *)&pmVar7->field_0x60 = *(uint *)&pmVar7->field_0x60 & 0xffbfffff;
      set_malign(pmVar7);
      __s = "Infidel, you have entered Moloch\'s Sanctum!";
      line = "Be gone!";
      bVar2 = false;
    }
    if ((bVar14 && bVar13) && (verbalize(__s), !bVar2)) {
      verbalize(line);
    }
    if (!bVar12 || !bVar11) {
      return;
    }
    if (bVar3 == '\0') {
      pcVar10 = "";
    }
    else {
      pcVar10 = " strange";
      if ((u.ualign.type == pmVar7->field_0x74) && (-4 < u.ualign.record)) {
        pline("You experience a strange sense of peace."," strange");
        return;
      }
    }
    pline("You have a%s forbidding feeling...",pcVar10);
    return;
  }
  uVar5 = mt_random();
  if (uVar5 % 3 == 1) {
    pcVar10 = "You feel like you are being watched.";
LAB_00228391:
    pline(pcVar10);
  }
  else {
    if (uVar5 % 3 == 0) {
      pcVar10 = "You have an eerie feeling...";
      goto LAB_00228391;
    }
    pcVar10 = body_part(0xc);
    pline("A shiver runs down your %s.",pcVar10);
  }
  uVar5 = mt_random();
  if (0x33333333 < uVar5 * -0x33333333) {
    return;
  }
  pmVar7 = makemon(mons + 0x12a,level,(int)u.ux,(int)u.uy,0);
  if (pmVar7 == (monst *)0x0) {
    return;
  }
  if (((u.uprops[0x1e].intrinsic != 0) ||
      (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
       (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
     ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) {
    if (((pmVar7->data->mflags1 & 0x10000) == 0) &&
       ((poVar8 = which_armor(pmVar7,4), poVar8 == (obj *)0x0 ||
        (poVar8 = which_armor(pmVar7,4), poVar8->otyp != 0x4f)))) {
      if (((u.uprops[0x1e].intrinsic == 0) &&
          (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
           (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
         ((((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')) ||
           (((youmonst.data != mons + 0x31 && youmonst.data != mons + 0x1e) &&
            (u.uprops[0x19].extrinsic == 0 && u.uprops[0x19].intrinsic == 0)) &&
            youmonst.data != mons + 0x32)) || (u.uprops[0x19].blocked != 0)))) {
        if ((u.uprops[0x19].extrinsic == 0) || (u.uprops[0x19].blocked != 0)) goto LAB_002287f2;
        iVar6 = dist2((int)pmVar7->mx,(int)pmVar7->my,(int)u.ux,(int)u.uy);
        pcVar10 = "An enormous ghost appears next to you!";
        if ((iVar6 < 0x41) || (u.uprops[0x42].intrinsic != 0)) goto LAB_0022880d;
        goto LAB_002287fc;
      }
    }
    else {
LAB_002287f2:
      if (u.uprops[0x42].intrinsic == 0) {
LAB_002287fc:
        if (u.uprops[0x42].extrinsic == 0) {
          bVar3 = match_warn_of_mon(pmVar7);
          pcVar10 = "An enormous ghost appears next to you!";
          if (bVar3 == '\0') {
            pcVar10 = "You sense a presence close by!";
          }
          goto LAB_0022880d;
        }
      }
    }
  }
  pcVar10 = "An enormous ghost appears next to you!";
LAB_0022880d:
  pline(pcVar10);
  pmVar7->field_0x62 = pmVar7->field_0x62 & 0xbf;
  set_malign(pmVar7);
  if (flags.verbose != '\0') {
    pline("You are frightened to death, and unable to move.");
  }
  nomul(-3,"frightened to death");
  nomovemsg = "You regain your composure.";
  return;
}

Assistant:

void intemple(int roomno)
{
	struct monst *priest = findpriest((char)roomno);
	boolean tended = (priest != NULL);
	boolean shrined, sanctum, can_speak;
	const char *msg1, *msg2;
	char buf[BUFSZ];

	if (!temple_occupied(u.urooms0)) {
	    if (tended) {
		shrined = has_shrine(priest);
		sanctum = (Is_sanctum(&u.uz) || In_endgame(&u.uz));
		can_speak = (priest->mcanmove && !priest->msleeping &&
			     flags.soundok);
		if (can_speak) {
		    unsigned save_priest = priest->ispriest;
		    /* don't reveal the altar's owner upon temple entry in
		       the endgame; for the Sanctum, the next message names
		       Moloch so suppress the "of Moloch" for him here too */
		    if (sanctum && !Hallucination) priest->ispriest = 0;
		    pline("%s intones:",
			canseemon(level, priest) ? Monnam(priest) : "A nearby voice");
		    priest->ispriest = save_priest;
		}
		msg2 = 0;
		if (sanctum && Is_sanctum(&u.uz)) {
		    if (priest->mpeaceful) {
			msg1 = "Infidel, you have entered Moloch's Sanctum!";
			msg2 = "Be gone!";
			priest->mpeaceful = 0;
			set_malign(priest);
		    } else
			msg1 = "You desecrate this place by your presence!";
		} else {
		    sprintf(buf, "Pilgrim, you enter a %s place!",
			    !shrined ? "desecrated" : "sacred");
		    msg1 = buf;
		}
		if (can_speak) {
		    verbalize(msg1);
		    if (msg2) verbalize(msg2);
		}
		if (!sanctum) {
		    /* !tended -> !shrined */
		    if (!shrined || !p_coaligned(priest) ||
			    u.ualign.record <= ALGN_SINNED)
			pline("You have a%s forbidding feeling...",
				(!shrined) ? "" : " strange");
		    else pline("You experience a strange sense of peace.");
		}
	    } else {
		switch(rn2(3)) {
		  case 0: pline("You have an eerie feeling..."); break;
		  case 1: pline("You feel like you are being watched."); break;
		  default: pline("A shiver runs down your %s.",
			body_part(SPINE)); break;
		}
		if (!rn2(5)) {
		    struct monst *mtmp;

		    if (!(mtmp = makemon(&mons[PM_GHOST], level, u.ux, u.uy, 
			                 NO_MM_FLAGS)))
			return;
		    if (!Blind || sensemon(mtmp))
			pline("An enormous ghost appears next to you!");
		    else pline("You sense a presence close by!");
		    mtmp->mpeaceful = 0;
		    set_malign(mtmp);
		    if (flags.verbose)
			pline("You are frightened to death, and unable to move.");
		    nomul(-3, "frightened to death");
		    nomovemsg = "You regain your composure.";
	       }
	   }
       }
}